

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool operator==(cmListFileContext *lhs,cmListFileContext *rhs)

{
  size_t __n;
  int iVar1;
  
  if ((lhs->Line == rhs->Line) &&
     (__n = (lhs->FilePath)._M_string_length, __n == (rhs->FilePath)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((lhs->FilePath)._M_dataplus._M_p,(rhs->FilePath)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const cmListFileContext& lhs, const cmListFileContext& rhs)
{
  return lhs.Line == rhs.Line && lhs.FilePath == rhs.FilePath;
}